

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_storage.cpp
# Opt level: O0

status_t __thiscall
libtorrent::aux::posix_storage::initialize
          (posix_storage *this,settings_interface *param_1,storage_error *ec)

{
  file_status *this_00;
  undefined8 uVar1;
  bool bVar2;
  int num_files;
  file_storage *pfVar3;
  value_type *this_01;
  int64_t iVar4;
  anon_class_8_1_ba1d7401 local_130;
  function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_long)>
  local_128;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&)>
  local_108;
  anon_class_8_1_8991fb9c local_e8;
  function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::storage_error_&)>
  local_e0;
  int local_c0;
  undefined1 local_b9;
  int local_b8;
  file_status_flag_t local_a4;
  undefined1 local_a0 [8];
  error_code err;
  undefined1 local_88 [8];
  string file_path;
  file_status s;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_38;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_34;
  file_storage *pfStack_30;
  file_index_t i;
  file_storage *fs;
  storage_error *ec_local;
  settings_interface *param_3_local;
  posix_storage *this_local;
  status_t ret;
  
  pfVar3 = files(this);
  num_files = file_storage::num_files(pfVar3);
  stat_cache::reserve(&this->m_stat_cache,num_files);
  pfStack_30 = files(this);
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>::
  bitfield_flag((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void> *)
                ((long)&this_local + 7));
  memset(&local_34,0,4);
  while( true ) {
    local_38 = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
               ::end_index(&this->m_file_priority);
    bVar2 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator<
                      (&local_34,&local_38);
    pfVar3 = pfStack_30;
    if (!bVar2) break;
    this_01 = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
              ::operator[](&this->m_file_priority,local_34);
    bVar2 = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::operator!=
                      (this_01,(strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>
                                *)&dont_download);
    if ((!bVar2) &&
       (bVar2 = file_storage::pad_file_at(pfStack_30,(file_index_t)local_34.m_val), !bVar2)) {
      this_00 = (file_status *)((long)&file_path.field_2 + 8);
      file_status::file_status(this_00);
      err.cat_._4_4_ = local_34.m_val;
      file_storage::file_path
                ((string *)local_88,pfStack_30,(file_index_t)local_34.m_val,&this->m_save_path);
      boost::system::error_code::error_code((error_code *)local_a0);
      libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::file_status_flag_tag,_void>::
      bitfield_flag(&local_a4);
      stat_file((string *)local_88,this_00,(error_code *)local_a0,local_a4);
      uVar1 = file_path.field_2._8_8_;
      local_b8 = local_34.m_val;
      iVar4 = file_storage::file_size(pfStack_30,(file_index_t)local_34.m_val);
      if (iVar4 < (long)uVar1) {
        local_b9 = 8;
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>::
        operator|=((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void> *)
                   ((long)&this_local + 7),
                   (bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>)0x8);
      }
      bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)local_a0);
      if (bVar2) {
        need_partfile(this);
      }
      else {
        local_c0 = local_34.m_val;
        use_partfile(this,(file_index_t)local_34.m_val,false);
      }
      ::std::__cxx11::string::~string((string *)local_88);
    }
    strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator++(&local_34);
  }
  local_e8.this = this;
  ::std::
  function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::storage_error&)>
  ::
  function<libtorrent::aux::posix_storage::initialize(libtorrent::settings_interface_const&,libtorrent::storage_error&)::__0,void>
            ((function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::storage_error&)>
              *)&local_e0,&local_e8);
  ::std::
  function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,libtorrent::storage_error&)>
  ::
  function<void(&)(std::__cxx11::string_const&,std::__cxx11::string_const&,libtorrent::storage_error&),void>
            ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,libtorrent::storage_error&)>
              *)&local_108,create_symlink);
  local_130.ret = (status_t *)((long)&this_local + 7);
  ::std::
  function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,long)>::
  function<libtorrent::aux::posix_storage::initialize(libtorrent::settings_interface_const&,libtorrent::storage_error&)::__1,void>
            ((function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,long)>
              *)&local_128,&local_130);
  initialize_storage(pfVar3,&this->m_save_path,&this->m_stat_cache,&this->m_file_priority,&local_e0,
                     &local_108,&local_128,ec);
  ::std::
  function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_long)>
  ::~function(&local_128);
  ::std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&)>
  ::~function(&local_108);
  ::std::
  function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::storage_error_&)>
  ::~function(&local_e0);
  return (status_t)this_local._7_1_;
}

Assistant:

status_t posix_storage::initialize(settings_interface const&, storage_error& ec)
	{
		m_stat_cache.reserve(files().num_files());

		file_storage const& fs = files();
		// if some files have priority 0, we need to check if they exist on the
		// filesystem, in which case we won't use a partfile for them.
		// this is to be backwards compatible with previous versions of
		// libtorrent, when part files were not supported.
		status_t ret{};
		for (file_index_t i(0); i < m_file_priority.end_index(); ++i)
		{
			if (m_file_priority[i] != dont_download || fs.pad_file_at(i))
				continue;

			file_status s;
			std::string const file_path = fs.file_path(i, m_save_path);
			error_code err;
			stat_file(file_path, &s, err);

			if (s.file_size > fs.file_size(i))
				ret |= disk_status::oversized_file;

			if (!err)
			{
				use_partfile(i, false);
			}
			else
			{
				need_partfile();
			}
		}

		aux::initialize_storage(fs, m_save_path, m_stat_cache, m_file_priority
			, [this](file_index_t const file_index, storage_error& e)
			{ open_file(file_index, aux::open_mode::write, 0, e); }
			, aux::create_symlink
			, [&ret](file_index_t, std::int64_t) { ret |= disk_status::oversized_file; }
			, ec);
		return ret;
	}